

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O0

TValue * index2adr(lua_State *L,int idx)

{
  GCObject *pGVar1;
  lua_State *local_50;
  Closure *func_1;
  TValue *i_o;
  Closure *func;
  TValue *o;
  int idx_local;
  lua_State *L_local;
  
  if (idx < 1) {
    if (idx < -9999) {
      if (idx == -0x2712) {
        L_local = (lua_State *)&L->l_gt;
      }
      else if (idx == -0x2711) {
        (L->env).value = (Value)(((L->ci->func->value).gc)->h).array;
        (L->env).tt = 5;
        L_local = (lua_State *)&L->env;
      }
      else if (idx == -10000) {
        L_local = (lua_State *)&L->l_G->l_registry;
      }
      else {
        pGVar1 = (L->ci->func->value).gc;
        if ((int)(uint)(pGVar1->h).lsizenode < -idx + -0x2712) {
          local_50 = (lua_State *)&luaO_nilobject_;
        }
        else {
          local_50 = (lua_State *)((long)pGVar1 + (long)(-idx + -0x2713) * 0x10 + 0x28);
        }
        L_local = local_50;
      }
    }
    else {
      L_local = (lua_State *)(L->top + idx);
    }
  }
  else {
    L_local = (lua_State *)(L->base + (idx + -1));
    if ((lua_State *)L->top <= L_local) {
      L_local = (lua_State *)&luaO_nilobject_;
    }
  }
  return (TValue *)L_local;
}

Assistant:

static TValue *index2adr (lua_State *L, int idx) {
  if (idx > 0) {
    TValue *o = L->base + (idx - 1);
    api_check(L, idx <= L->ci->top - L->base);
    if (o >= L->top) return cast(TValue *, luaO_nilobject);
    else return o;
  }
  else if (idx > LUA_REGISTRYINDEX) {
    api_check(L, idx != 0 && -idx <= L->top - L->base);
    return L->top + idx;
  }
  else switch (idx) {  /* pseudo-indices */
    case LUA_REGISTRYINDEX: return registry(L);
    case LUA_ENVIRONINDEX: {
      Closure *func = curr_func(L);
      sethvalue(L, &L->env, func->c.env);
      return &L->env;
    }
    case LUA_GLOBALSINDEX: return gt(L);
    default: {
      Closure *func = curr_func(L);
      idx = LUA_GLOBALSINDEX - idx;
      return (idx <= func->c.nupvalues)
                ? &func->c.upvalue[idx-1]
                : cast(TValue *, luaO_nilobject);
    }
  }
}